

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

RenderBox * __thiscall
Rml::Element::GetRenderBox
          (RenderBox *__return_storage_ptr__,Element *this,BoxArea fill_area,int index)

{
  ulong uVar1;
  uint uVar2;
  pointer pPVar3;
  ElementMeta *pEVar4;
  code *pcVar5;
  undefined1 auVar6 [12];
  bool bVar7;
  BoxArea area;
  pointer this_00;
  float fVar8;
  float fVar9;
  Vector2f VVar10;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  Vector2f local_68;
  float local_58;
  float fStack_54;
  undefined8 local_48;
  undefined1 auVar12 [16];
  
  if ((2 < fill_area - Border) &&
     (bVar7 = Assert("Render box can only be generated with fill area of border, padding or content."
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x1f7), !bVar7)) {
LAB_00218d0d:
    pcVar5 = (code *)invalidInstructionException();
    (*pcVar5)();
  }
  UpdateAbsoluteOffsetAndRenderBoxData(this);
  if ((index < 1) ||
     (pPVar3 = (this->additional_boxes).
               super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->additional_boxes).
                         super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) >> 6) < index))
  {
    this_00 = (pointer)&this->main_box;
    local_68 = this->rounded_main_padding_size;
    local_58 = 0.0;
    fStack_54 = 0.0;
  }
  else {
    this_00 = pPVar3 + ((ulong)(uint)index - 1);
    local_68 = Box::GetSize(&this_00->box,Padding);
    local_58 = Math::Round(pPVar3[(ulong)(uint)index - 1].offset.x);
    fStack_54 = Math::Round(pPVar3[(ulong)(uint)index - 1].offset.y);
  }
  fVar14 = 0.0;
  fVar15 = 0.0;
  local_48 = 0;
  if (1 < (int)fill_area) {
    local_48 = 0;
    area = Border;
    do {
      fVar8 = Box::GetEdge(&this_00->box,area,Top);
      fVar9 = Box::GetEdge(&this_00->box,area,Right);
      local_48 = CONCAT44(local_48._4_4_ + fVar9,(float)local_48 + fVar8);
      fVar8 = Box::GetEdge(&this_00->box,area,Bottom);
      fVar9 = Box::GetEdge(&this_00->box,area,Left);
      fVar14 = fVar14 + fVar8;
      fVar15 = fVar15 + fVar9;
      area = area + Border;
    } while (fill_area != area);
  }
  switch(fill_area) {
  case Margin:
  case Auto:
    bVar7 = Assert("RMLUI_ERROR",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                   ,0x219);
    local_68.x = 0.0;
    local_68.y = 0.0;
    if (!bVar7) goto LAB_00218d0d;
    break;
  case Border:
    VVar10 = Box::GetFrameSize(&this_00->box,Border);
    local_68.x = local_68.x + VVar10.x;
    local_68.y = local_68.y + VVar10.y;
    break;
  case Padding:
    break;
  case Content:
    VVar10 = Box::GetFrameSize(&this_00->box,Padding);
    local_68.x = local_68.x - VVar10.x;
    local_68.y = local_68.y - VVar10.y;
    break;
  default:
    local_68.x = 0.0;
    local_68.y = 0.0;
  }
  pEVar4 = this->meta;
  uVar1._0_2_ = (pEVar4->computed_values).rare.border_top_left_radius;
  uVar1._2_2_ = (pEVar4->computed_values).rare.border_top_right_radius;
  uVar1._4_2_ = (pEVar4->computed_values).rare.border_bottom_right_radius;
  uVar1._6_2_ = (pEVar4->computed_values).rare.border_bottom_left_radius;
  auVar12._8_4_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12._12_2_ = uVar1._6_2_;
  auVar12._14_2_ = uVar1._6_2_;
  auVar11._12_4_ = auVar12._12_4_;
  auVar11._8_2_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11._10_2_ = uVar1._4_2_;
  auVar13._10_6_ = auVar11._10_6_;
  auVar13._8_2_ = uVar1._4_2_;
  auVar13._0_8_ = uVar1;
  auVar6._4_8_ = auVar13._8_8_;
  auVar6._2_2_ = uVar1._2_2_;
  auVar6._0_2_ = uVar1._2_2_;
  uVar2._0_2_ = (pEVar4->computed_values).rare.border_bottom_right_radius;
  uVar2._2_2_ = (pEVar4->computed_values).rare.border_bottom_left_radius;
  auVar13 = pshuflw(ZEXT416(uVar2),ZEXT416(uVar2),0x60);
  (__return_storage_ptr__->fill_size).x = local_68.x;
  (__return_storage_ptr__->fill_size).y = local_68.y;
  (__return_storage_ptr__->border_offset).x = local_58;
  (__return_storage_ptr__->border_offset).y = fStack_54;
  *(undefined8 *)(__return_storage_ptr__->border_widths)._M_elems = local_48;
  *(ulong *)((__return_storage_ptr__->border_widths)._M_elems + 2) = CONCAT44(fVar15,fVar14);
  *(ulong *)(__return_storage_ptr__->border_radius)._M_elems =
       CONCAT44((float)(auVar6._0_4_ >> 0x10),(float)(int)(short)(undefined2)uVar1);
  *(ulong *)((__return_storage_ptr__->border_radius)._M_elems + 2) =
       CONCAT44((float)(auVar13._4_4_ >> 0x10),(float)(auVar13._0_4_ >> 0x10));
  return __return_storage_ptr__;
}

Assistant:

RenderBox Element::GetRenderBox(BoxArea fill_area, int index)
{
	RMLUI_ASSERTMSG(fill_area >= BoxArea::Border && fill_area <= BoxArea::Content,
		"Render box can only be generated with fill area of border, padding or content.");

	UpdateAbsoluteOffsetAndRenderBoxData();

	struct BoxReference {
		const Box& box;
		Vector2f padding_size;
		Vector2f offset;
	};
	auto GetBoxAndOffset = [this, index]() {
		const int additional_box_index = index - 1;
		if (index < 1 || additional_box_index >= (int)additional_boxes.size())
			return BoxReference{main_box, rounded_main_padding_size, {}};
		const PositionedBox& positioned_box = additional_boxes[additional_box_index];
		return BoxReference{positioned_box.box, positioned_box.box.GetSize(BoxArea::Padding), positioned_box.offset.Round()};
	};

	BoxReference box = GetBoxAndOffset();

	EdgeSizes edge_sizes = {};
	for (int area = (int)BoxArea::Border; area < (int)fill_area; area++)
	{
		edge_sizes[0] += box.box.GetEdge(BoxArea(area), BoxEdge::Top);
		edge_sizes[1] += box.box.GetEdge(BoxArea(area), BoxEdge::Right);
		edge_sizes[2] += box.box.GetEdge(BoxArea(area), BoxEdge::Bottom);
		edge_sizes[3] += box.box.GetEdge(BoxArea(area), BoxEdge::Left);
	}
	Vector2f inner_size;
	switch (fill_area)
	{
	case BoxArea::Border: inner_size = box.padding_size + box.box.GetFrameSize(BoxArea::Border); break;
	case BoxArea::Padding: inner_size = box.padding_size; break;
	case BoxArea::Content: inner_size = box.padding_size - box.box.GetFrameSize(BoxArea::Padding); break;
	case BoxArea::Margin:
	case BoxArea::Auto: RMLUI_ERROR;
	}

	return RenderBox{inner_size, box.offset, edge_sizes, meta->computed_values.border_radius()};
}